

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lptree.c
# Opt level: O3

int verifyrule(lua_State *L,TTree *tree,int *passed,int npassed,int nb)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar7 = (ulong)npassed;
  uVar4 = 1000;
  if (1000 < npassed) {
    uVar4 = (ulong)(uint)npassed;
  }
LAB_0012b02f:
  do {
    switch(tree->tag) {
    case '\0':
    case '\x01':
    case '\x02':
    case '\x04':
      return nb;
    case '\x03':
    case '\x0e':
      return 1;
    case '\x05':
    case '\b':
    case '\t':
      tree = tree + 1;
      nb = 1;
      goto LAB_0012b02f;
    case '\x06':
      iVar2 = verifyrule(L,tree + 1,passed,(int)uVar7,0);
      if (iVar2 == 0) {
        return nb;
      }
      break;
    case '\a':
      nb = verifyrule(L,tree + 1,passed,(int)uVar7,nb);
      break;
    case '\n':
      break;
    default:
      return 0;
    case '\f':
      if (uVar7 == uVar4) {
        uVar3 = (uint)uVar4;
        do {
          uVar3 = uVar3 - 1;
          lVar1 = uVar4 - 1;
          uVar4 = uVar4 - 1;
          uVar7 = (ulong)uVar3;
          do {
            uVar6 = (int)uVar7 - 1;
            uVar7 = (ulong)uVar6;
            if (passed[lVar1] == passed[uVar7]) {
              lua_rawgeti(L,-1,(long)passed[lVar1]);
              pcVar5 = val2str(L,-1);
              luaL_error(L,"rule \'%s\' may be left recursive",pcVar5);
            }
          } while (0 < (int)uVar6);
        } while (1 < uVar4);
        luaL_error(L,"too many left calls in grammar");
      }
      passed[uVar7] = (uint)tree->key;
      uVar7 = uVar7 + 1;
      goto switchD_0012b041_caseD_f;
    case '\r':
      iVar2 = checkaux(tree,0);
      return iVar2;
    case '\x0f':
    case '\x10':
      goto switchD_0012b041_caseD_f;
    }
    tree = tree + (tree->u).ps;
  } while( true );
switchD_0012b041_caseD_f:
  tree = tree + 1;
  goto LAB_0012b02f;
}

Assistant:

static int verifyrule (lua_State *L, TTree *tree, int *passed, int npassed,
                       int nb) {
 tailcall:
  switch (tree->tag) {
    case TChar: case TSet: case TAny:
    case TFalse:
      return nb;  /* cannot pass from here */
    case TTrue:
    case TBehind:  /* look-behind cannot have calls */
      return 1;
    case TNot: case TAnd: case TRep:
      /* return verifyrule(L, sib1(tree), passed, npassed, 1); */
      tree = sib1(tree); nb = 1; goto tailcall;
    case TCapture: case TRunTime:
      /* return verifyrule(L, sib1(tree), passed, npassed, nb); */
      tree = sib1(tree); goto tailcall;
    case TCall:
      /* return verifyrule(L, sib2(tree), passed, npassed, nb); */
      tree = sib2(tree); goto tailcall;
    case TSeq:  /* only check 2nd child if first is nb */
      if (!verifyrule(L, sib1(tree), passed, npassed, 0))
        return nb;
      /* else return verifyrule(L, sib2(tree), passed, npassed, nb); */
      tree = sib2(tree); goto tailcall;
    case TChoice:  /* must check both children */
      nb = verifyrule(L, sib1(tree), passed, npassed, nb);
      /* return verifyrule(L, sib2(tree), passed, npassed, nb); */
      tree = sib2(tree); goto tailcall;
    case TRule:
      if (npassed >= MAXRULES)
        return verifyerror(L, passed, npassed);
      else {
        passed[npassed++] = tree->key;
        /* return verifyrule(L, sib1(tree), passed, npassed); */
        tree = sib1(tree); goto tailcall;
      }
    case TGrammar:
      return nullable(tree);  /* sub-grammar cannot be left recursive */
    default: assert(0); return 0;
  }
}